

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,string *value)

{
  char *pcVar1;
  Value *in_RDI;
  uint in_stack_000001cc;
  char *in_stack_000001d0;
  
  initBasic(in_RDI,stringValue,true);
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  pcVar1 = duplicateAndPrefixStringValue(in_stack_000001d0,in_stack_000001cc);
  (in_RDI->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const std::string& value) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateAndPrefixStringValue(value.data(), static_cast<unsigned>(value.length()));
}